

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWSImporter::ReadEnvelope(LWSImporter *this,Element *dad,Envelope *fill)

{
  _List_node_base *p_Var1;
  iterator __position;
  int iVar2;
  _List_node_base *p_Var3;
  char *pcVar4;
  Logger *pLVar5;
  char cVar6;
  PrePostBehaviour PVar7;
  InterpolationType IVar8;
  uint uVar9;
  ulong __n;
  long lVar10;
  pointer pKVar11;
  char *pcVar12;
  long lVar13;
  float f;
  Key local_58;
  
  p_Var1 = (dad->children).
           super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)&dad->children) {
    pLVar5 = DefaultLogger::get();
    Logger::error(pLVar5,"LWS: Envelope descriptions must not be empty");
    return;
  }
  p_Var3 = p_Var1[3]._M_next;
  cVar6 = *(char *)&p_Var3->_M_next;
  __n = 0;
  if (0xf5 < (byte)(cVar6 - 0x3aU)) {
    do {
      p_Var3 = (_List_node_base *)((long)&p_Var3->_M_next + 1);
      uVar9 = (uint)(byte)(cVar6 - 0x30) + (int)__n * 10;
      __n = (ulong)uVar9;
      cVar6 = *(char *)&p_Var3->_M_next;
    } while (0xf5 < (byte)(cVar6 - 0x3aU));
    __n = (ulong)uVar9;
  }
  std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::reserve(&fill->keys,__n);
  p_Var1 = p_Var1->_M_next;
  do {
    if (p_Var1 == (_List_node_base *)&dad->children) {
      return;
    }
    pcVar12 = (char *)p_Var1[3]._M_next;
    iVar2 = std::__cxx11::string::compare((char *)(p_Var1 + 1));
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)(p_Var1 + 1));
      if (iVar2 == 0) {
        for (; (cVar6 = *pcVar12, cVar6 == ' ' || (cVar6 == '\t')); pcVar12 = pcVar12 + 1) {
        }
        PVar7 = PrePostBehaviour_Reset;
        if (0xf5 < (byte)(cVar6 - 0x3aU)) {
          PVar7 = PrePostBehaviour_Reset;
          do {
            PVar7 = (uint)(byte)(cVar6 - 0x30) + PVar7 * 10;
            cVar6 = pcVar12[1];
            pcVar12 = pcVar12 + 1;
          } while (0xf5 < (byte)(cVar6 - 0x3aU));
        }
        fill->pre = PVar7;
        pcVar4 = pcVar12;
        while( true ) {
          pcVar4 = pcVar4 + 1;
          cVar6 = *pcVar12;
          if ((cVar6 != ' ') && (cVar6 != '\t')) break;
          pcVar12 = pcVar12 + 1;
        }
        PVar7 = PrePostBehaviour_Reset;
        if (0xf5 < (byte)(cVar6 - 0x3aU)) {
          PVar7 = PrePostBehaviour_Reset;
          do {
            PVar7 = (uint)(byte)(cVar6 - 0x30) + PVar7 * 10;
            cVar6 = *pcVar4;
            pcVar4 = pcVar4 + 1;
          } while (0xf5 < (byte)(cVar6 - 0x3aU));
        }
        fill->post = PVar7;
      }
      goto LAB_00437488;
    }
    local_58.time = 0.0;
    local_58.value = 0.0;
    local_58.inter = IT_LINE;
    local_58.params[0] = 0.0;
    local_58.params[1] = 0.0;
    local_58.params[2] = 0.0;
    local_58.params[3] = 0.0;
    local_58.params[4] = 0.0;
    __position._M_current =
         (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::
      _M_realloc_insert<Assimp::LWO::Key>(&fill->keys,__position,&local_58);
      pKVar11 = (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *(ulong *)((__position._M_current)->params + 4) = (ulong)(uint)local_58._36_4_ << 0x20;
      (__position._M_current)->params[0] = 0.0;
      (__position._M_current)->params[1] = 0.0;
      (__position._M_current)->params[2] = 0.0;
      (__position._M_current)->params[3] = 0.0;
      (__position._M_current)->time = 0.0;
      (__position._M_current)->value = 0.0;
      (__position._M_current)->inter = IT_LINE;
      pKVar11 = (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                ._M_impl.super__Vector_impl_data._M_finish + 1;
      (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
      super__Vector_impl_data._M_finish = pKVar11;
    }
    for (; (*pcVar12 == ' ' || (*pcVar12 == '\t')); pcVar12 = pcVar12 + 1) {
    }
    for (pcVar12 = fast_atoreal_move<float>(pcVar12,&pKVar11[-1].value,true);
        (*pcVar12 == ' ' || (*pcVar12 == '\t')); pcVar12 = pcVar12 + 1) {
    }
    pcVar12 = fast_atoreal_move<float>(pcVar12,(float *)&local_58,true);
    pKVar11[-1].time = (double)local_58.time._0_4_;
    cVar6 = *pcVar12;
    lVar13 = 5;
    IVar8 = IT_TCB;
    if ((byte)(cVar6 - 0x3aU) < 0xf6) goto switchD_00437426_caseD_0;
    iVar2 = 0;
    do {
      iVar2 = (uint)(byte)(cVar6 - 0x30) + iVar2 * 10;
      cVar6 = pcVar12[1];
      pcVar12 = pcVar12 + 1;
    } while (0xf5 < (byte)(cVar6 - 0x3aU));
    switch(iVar2) {
    case 0:
      goto switchD_00437426_caseD_0;
    case 1:
    case 2:
      IVar8 = IT_HERM;
      goto switchD_00437426_caseD_0;
    case 3:
      pKVar11[-1].inter = IT_LINE;
      break;
    case 4:
      pKVar11[-1].inter = IT_STEP;
      break;
    case 5:
      lVar13 = 4;
      IVar8 = IT_BEZ2;
switchD_00437426_caseD_0:
      pKVar11[-1].inter = IVar8;
      lVar10 = 0;
      do {
        for (; (*pcVar12 == ' ' || (*pcVar12 == '\t')); pcVar12 = pcVar12 + 1) {
        }
        pcVar12 = fast_atoreal_move<float>(pcVar12,pKVar11->params + lVar10 + -10,true);
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar13);
      break;
    default:
      pLVar5 = DefaultLogger::get();
      Logger::error(pLVar5,"LWS: Unknown span type");
    }
LAB_00437488:
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

void LWSImporter::ReadEnvelope(const LWS::Element& dad, LWO::Envelope& fill )
{
    if (dad.children.empty()) {
        ASSIMP_LOG_ERROR("LWS: Envelope descriptions must not be empty");
        return;
    }

    // reserve enough storage
    std::list< LWS::Element >::const_iterator it = dad.children.begin();;
    fill.keys.reserve(strtoul10(it->tokens[1].c_str()));

    for (++it; it != dad.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        if ((*it).tokens[0] == "Key") {
            fill.keys.push_back(LWO::Key());
            LWO::Key& key = fill.keys.back();

            float f;
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,key.value);
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,f);

            key.time = f;

            unsigned int span = strtoul10(c,&c), num = 0;
            switch (span) {

                case 0:
                    key.inter = LWO::IT_TCB;
                    num = 5;
                    break;
                case 1:
                case 2:
                    key.inter = LWO::IT_HERM;
                    num = 5;
                    break;
                case 3:
                    key.inter = LWO::IT_LINE;
                    num = 0;
                    break;
                case 4:
                    key.inter = LWO::IT_STEP;
                    num = 0;
                    break;
                case 5:
                    key.inter = LWO::IT_BEZ2;
                    num = 4;
                    break;
                default:
                    ASSIMP_LOG_ERROR("LWS: Unknown span type");
            }
            for (unsigned int i = 0; i < num;++i) {
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c,key.params[i]);
            }
        }
        else if ((*it).tokens[0] == "Behaviors") {
            SkipSpaces(&c);
            fill.pre = (LWO::PrePostBehaviour) strtoul10(c,&c);
            SkipSpaces(&c);
            fill.post = (LWO::PrePostBehaviour) strtoul10(c,&c);
        }
    }
}